

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tankmixmodel.cpp
# Opt level: O3

double __thiscall
TankMixModel::findLIFOQuality(TankMixModel *this,double vNet,double vIn,double wIn,SegPool *segPool)

{
  double dVar1;
  double dVar2;
  Segment *pSVar3;
  Segment *pSVar4;
  SystemError *this_00;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar5 = 0.0;
  if (vNet <= 0.0) {
    if (0.0 <= vNet) {
      return this->cTank;
    }
    dVar6 = -vNet;
    dVar7 = 0.0;
    do {
      pSVar4 = this->firstSeg;
      if (pSVar4 == (Segment *)0x0) break;
      dVar1 = pSVar4->v;
      pSVar3 = pSVar4->next;
      dVar8 = dVar6;
      if ((pSVar3 != (Segment *)0x0) && (dVar1 <= dVar6)) {
        dVar8 = dVar1;
      }
      dVar2 = pSVar4->c;
      dVar6 = dVar6 - dVar8;
      if (((pSVar3 == (Segment *)0x0) || (dVar6 < 0.0)) || (dVar8 < dVar1)) {
        pSVar4->v = dVar1 - dVar8;
      }
      else {
        this->firstSeg = pSVar3;
        SegPool::freeSegment(segPool,pSVar4);
      }
      dVar7 = dVar7 + dVar8;
      dVar5 = dVar5 + dVar2 * dVar8;
    } while (0.0 < dVar6);
    dVar5 = (dVar5 + wIn) / (dVar7 + vIn);
  }
  else {
    pSVar4 = this->firstSeg;
    if ((pSVar4 == (Segment *)0x0) || (dVar5 = pSVar4->c, this->cTol <= ABS(dVar5 - wIn / vIn))) {
      pSVar4 = SegPool::getSegment(segPool,vNet,wIn / vIn);
      if (pSVar4 == (Segment *)0x0) {
        this_00 = (SystemError *)__cxa_allocate_exception(0x30);
        SystemError::SystemError(this_00,0);
        __cxa_throw(this_00,&SystemError::typeinfo,ENerror::~ENerror);
      }
      pSVar4->next = this->firstSeg;
      this->firstSeg = pSVar4;
      dVar5 = pSVar4->c;
    }
    else {
      pSVar4->v = vNet + pSVar4->v;
    }
  }
  this->cTank = dVar5;
  return dVar5;
}

Assistant:

double TankMixModel::findLIFOQuality(double vNet, double vIn, double wIn,
                                     SegPool* segPool)
{
    // ... if filling then create a new first segment
    if ( vNet > 0.0 )
    {
        // ... increase current first segment volume if inflow has same quality
        double cIn = wIn / vIn;
        if ( firstSeg && abs(firstSeg->c - cIn ) < cTol ) firstSeg->v += vNet;

        // ... otherwise add a new first segment to the tank
        else
        {
            Segment* seg = segPool->getSegment(vNet, cIn);
            if ( seg == nullptr ) throw SystemError(SystemError::OUT_OF_MEMORY);
            seg->next = firstSeg;
            firstSeg = seg;
        }
        cTank = firstSeg->c;
    }

    // ... if emptying then remove first segments until vNet is reached
    else if ( vNet < 0.0 )
    {
        double vSum = 0.0;
        double wSum = 0.0;
        vNet = -vNet;
        while ( vNet > 0.0 )
        {
            Segment* seg = firstSeg;
            if ( seg == nullptr ) break;
            double vSeg = min(seg->v, vNet);
            if ( seg->next == nullptr ) vSeg = vNet;
            vSum += vSeg;
            wSum += seg->c * vSeg;
            vNet -= vSeg;
            if ( vNet >= 0.0 && vSeg >= seg->v && seg->next )
            {
                firstSeg = seg->next;
                segPool->freeSegment(seg);
            }
            else seg->v -= vSeg;
        }

        // ... avg. quality released is mixture of quality in flow
        //     released and any inflow
        cTank = (wSum + wIn) / (vSum + vIn);
    }
    return cTank;
 }